

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall
absl::Mutex::EnableInvariantDebugging(Mutex *this,_func_void_void_ptr *invariant,void *arg)

{
  bool bVar1;
  SynchEvent *e_00;
  SynchEvent *e;
  void *arg_local;
  _func_void_void_ptr *invariant_local;
  Mutex *this_local;
  
  bVar1 = std::atomic<bool>::load
                    ((atomic<bool> *)&(anonymous_namespace)::synch_check_invariants,acquire);
  if ((bVar1) && (invariant != (_func_void_void_ptr *)0x0)) {
    e_00 = EnsureSynchEvent(&this->mu_,(char *)0x0,0x10,0x40);
    e_00->invariant = invariant;
    e_00->arg = arg;
    UnrefSynchEvent(e_00);
  }
  return;
}

Assistant:

void Mutex::EnableInvariantDebugging(void (*invariant)(void *),
                                     void *arg) {
  if (synch_check_invariants.load(std::memory_order_acquire) &&
      invariant != nullptr) {
    SynchEvent *e = EnsureSynchEvent(&this->mu_, nullptr, kMuEvent, kMuSpin);
    e->invariant = invariant;
    e->arg = arg;
    UnrefSynchEvent(e);
  }
}